

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Byte.cpp
# Opt level: O2

String * __thiscall cplus::lang::Byte::toString(String *__return_storage_ptr__,Byte *this)

{
  toHexString(__return_storage_ptr__,this);
  return __return_storage_ptr__;
}

Assistant:

String Byte::toString() const {
			return toHexString();
		}